

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter_avx2.c
# Opt level: O0

void av1_build_compound_diffwtd_mask_highbd_avx2
               (uint8_t *mask,DIFFWTD_MASK_TYPE mask_type,uint8_t *src0,int src0_stride,
               uint8_t *src1,int src1_stride,int h,int w,int bd)

{
  undefined1 (*pauVar1) [12];
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  int in_ECX;
  long in_RDX;
  char in_SIL;
  long in_RDI;
  long in_R8;
  int in_R9D;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  int in_stack_00000008;
  __m128i m0_3;
  __m256i m_3;
  __m256i diff_3;
  __m256i s1_3;
  __m256i s0_3;
  int j_3;
  int i_3;
  __m128i m0_2;
  __m256i m_2;
  __m256i diff_2;
  __m256i s1_2;
  __m256i s0_2;
  int j_2;
  int i_2;
  __m128i xshift;
  __m128i m0_1;
  __m256i m_1;
  __m256i diff_1;
  __m256i s1_1;
  __m256i s0_1;
  int j_1;
  int i_1;
  __m128i m0;
  __m256i m;
  __m256i diff;
  __m256i s1;
  __m256i s0;
  int j;
  int i;
  uint16_t *ssrc1;
  uint16_t *ssrc0;
  __m256i ymask_base;
  int mask_base;
  __m256i yAOM_BLEND_A64_MAX_ALPHA;
  __m256i y0;
  undefined8 local_ca0;
  undefined8 uStackY_c98;
  int local_c18;
  int local_c14;
  undefined8 local_c00;
  undefined8 uStackY_bf8;
  int local_b68;
  int local_b64;
  undefined8 local_b40;
  undefined8 uStackY_b38;
  undefined1 in_stack_fffffffffffff4e0 [32];
  uint8_t *in_stack_fffffffffffff500;
  int local_ab8;
  int local_ab4;
  undefined8 local_aa0;
  undefined8 uStack_a98;
  int local_a18;
  int local_a14;
  long local_a10;
  long local_a08;
  long local_950;
  int in_stack_fffffffffffff9c8;
  undefined4 uStack_634;
  int in_stack_fffffffffffff9d0;
  undefined4 uStack_62c;
  int in_stack_fffffffffffff9d8;
  undefined4 uStack_624;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 uStack_90;
  undefined8 uStack_88;
  
  if (h < 0x10) {
    av1_build_compound_diffwtd_mask_highbd_ssse3
              (in_stack_fffffffffffff500,in_stack_fffffffffffff4e0[0x1f],
               in_stack_fffffffffffff4e0._16_8_,in_stack_fffffffffffff4e0._12_4_,
               in_stack_fffffffffffff4e0._0_8_,local_b40._28_4_,in_stack_fffffffffffff9c8,
               in_stack_fffffffffffff9d0,in_stack_fffffffffffff9d8);
  }
  else {
    auVar2 = vpinsrw_avx(ZEXT216(0x40),0x40,1);
    auVar2 = vpinsrw_avx(auVar2,0x40,2);
    auVar2 = vpinsrw_avx(auVar2,0x40,3);
    auVar2 = vpinsrw_avx(auVar2,0x40,4);
    auVar2 = vpinsrw_avx(auVar2,0x40,5);
    auVar2 = vpinsrw_avx(auVar2,0x40,6);
    auVar2 = vpinsrw_avx(auVar2,0x40,7);
    auVar15 = vpinsrw_avx(ZEXT216(0x40),0x40,1);
    auVar15 = vpinsrw_avx(auVar15,0x40,2);
    auVar15 = vpinsrw_avx(auVar15,0x40,3);
    auVar15 = vpinsrw_avx(auVar15,0x40,4);
    auVar15 = vpinsrw_avx(auVar15,0x40,5);
    auVar15 = vpinsrw_avx(auVar15,0x40,6);
    auVar15 = vpinsrw_avx(auVar15,0x40,7);
    uStack_d0 = auVar15._0_8_;
    uStack_c8 = auVar15._8_8_;
    auVar15 = vpinsrw_avx(ZEXT216(0x26),0x26,1);
    auVar15 = vpinsrw_avx(auVar15,0x26,2);
    auVar15 = vpinsrw_avx(auVar15,0x26,3);
    auVar15 = vpinsrw_avx(auVar15,0x26,4);
    auVar15 = vpinsrw_avx(auVar15,0x26,5);
    auVar15 = vpinsrw_avx(auVar15,0x26,6);
    auVar15 = vpinsrw_avx(auVar15,0x26,7);
    auVar14 = vpinsrw_avx(ZEXT216(0x26),0x26,1);
    auVar14 = vpinsrw_avx(auVar14,0x26,2);
    auVar14 = vpinsrw_avx(auVar14,0x26,3);
    auVar14 = vpinsrw_avx(auVar14,0x26,4);
    auVar14 = vpinsrw_avx(auVar14,0x26,5);
    auVar14 = vpinsrw_avx(auVar14,0x26,6);
    auVar14 = vpinsrw_avx(auVar14,0x26,7);
    auVar14 = ZEXT116(0) * auVar15 + ZEXT116(1) * auVar14;
    auVar15 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar15;
    uStack_90 = auVar15._0_8_;
    uStack_88 = auVar15._8_8_;
    local_a08 = in_RDX << 1;
    local_a10 = in_R8 << 1;
    local_950 = in_RDI;
    if (w == 8) {
      if (in_SIL == '\x01') {
        for (local_a14 = 0; local_a14 < in_stack_00000008; local_a14 = local_a14 + 1) {
          for (local_a18 = 0; local_a18 < h; local_a18 = local_a18 + 0x10) {
            auVar3 = vpsubw_avx2(*(undefined1 (*) [32])(local_a08 + (long)local_a18 * 2),
                                 *(undefined1 (*) [32])(local_a10 + (long)local_a18 * 2));
            auVar3 = vpabsw_avx2(auVar3);
            auVar3 = vpsraw_avx2(auVar3,ZEXT416(4));
            auVar13._16_8_ = uStack_90;
            auVar13._0_16_ = auVar14;
            auVar13._24_8_ = uStack_88;
            auVar3 = vpaddw_avx2(auVar3,auVar13);
            auVar3 = vpmaxsw_avx2(ZEXT1632(ZEXT816(0)),auVar3);
            auVar9._16_8_ = uStack_d0;
            auVar9._0_16_ = auVar2;
            auVar9._24_8_ = uStack_c8;
            auVar3 = vpminsw_avx2(auVar3,auVar9);
            auVar5._16_8_ = uStack_d0;
            auVar5._0_16_ = auVar2;
            auVar5._24_8_ = uStack_c8;
            auVar3 = vpsubw_avx2(auVar5,auVar3);
            auVar3 = vpackuswb_avx2(auVar3,auVar3);
            auVar3 = vpermq_avx2(auVar3,8);
            local_aa0 = auVar3._0_8_;
            uStack_a98 = auVar3._8_8_;
            *(undefined8 *)(local_950 + local_a18) = local_aa0;
            ((undefined8 *)(local_950 + local_a18))[1] = uStack_a98;
          }
          local_a08 = local_a08 + (long)in_ECX * 2;
          local_a10 = local_a10 + (long)in_R9D * 2;
          local_950 = local_950 + h;
        }
      }
      else {
        for (local_ab4 = 0; local_ab4 < in_stack_00000008; local_ab4 = local_ab4 + 1) {
          for (local_ab8 = 0; local_ab8 < h; local_ab8 = local_ab8 + 0x10) {
            auVar3 = vpsubw_avx2(*(undefined1 (*) [32])(local_a08 + (long)local_ab8 * 2),
                                 *(undefined1 (*) [32])(local_a10 + (long)local_ab8 * 2));
            auVar3 = vpabsw_avx2(auVar3);
            auVar3 = vpsraw_avx2(auVar3,ZEXT416(4));
            auVar12._16_8_ = uStack_90;
            auVar12._0_16_ = auVar14;
            auVar12._24_8_ = uStack_88;
            auVar3 = vpaddw_avx2(auVar3,auVar12);
            auVar3 = vpmaxsw_avx2(ZEXT1632(ZEXT816(0)),auVar3);
            auVar8._16_8_ = uStack_d0;
            auVar8._0_16_ = auVar2;
            auVar8._24_8_ = uStack_c8;
            auVar3 = vpminsw_avx2(auVar3,auVar8);
            auVar3 = vpackuswb_avx2(auVar3,auVar3);
            auVar3 = vpermq_avx2(auVar3,8);
            local_b40 = auVar3._0_8_;
            uStackY_b38 = auVar3._8_8_;
            *(undefined8 *)(local_950 + local_ab8) = local_b40;
            ((undefined8 *)(local_950 + local_ab8))[1] = uStackY_b38;
          }
          local_a08 = local_a08 + (long)in_ECX * 2;
          local_a10 = local_a10 + (long)in_R9D * 2;
          local_950 = local_950 + h;
        }
      }
    }
    else {
      auVar15._8_8_ = 0;
      auVar15._0_8_ = (long)(w + -4);
      auVar16._8_8_ = 0;
      auVar16._0_8_ = (long)(w + -4);
      auVar15 = vpunpcklqdq_avx(auVar15,auVar16);
      if (in_SIL == '\x01') {
        for (local_b64 = 0; local_b64 < in_stack_00000008; local_b64 = local_b64 + 1) {
          for (local_b68 = 0; local_b68 < h; local_b68 = local_b68 + 0x10) {
            auVar3 = vpsubw_avx2(*(undefined1 (*) [32])(local_a08 + (long)local_b68 * 2),
                                 *(undefined1 (*) [32])(local_a10 + (long)local_b68 * 2));
            auVar3 = vpabsw_avx2(auVar3);
            auVar3 = vpsraw_avx2(auVar3,auVar15);
            auVar11._16_8_ = uStack_90;
            auVar11._0_16_ = auVar14;
            auVar11._24_8_ = uStack_88;
            auVar3 = vpaddw_avx2(auVar3,auVar11);
            auVar3 = vpmaxsw_avx2(ZEXT1632(ZEXT816(0)),auVar3);
            auVar7._16_8_ = uStack_d0;
            auVar7._0_16_ = auVar2;
            auVar7._24_8_ = uStack_c8;
            auVar3 = vpminsw_avx2(auVar3,auVar7);
            auVar4._16_8_ = uStack_d0;
            auVar4._0_16_ = auVar2;
            auVar4._24_8_ = uStack_c8;
            auVar3 = vpsubw_avx2(auVar4,auVar3);
            auVar3 = vpackuswb_avx2(auVar3,auVar3);
            auVar3 = vpermq_avx2(auVar3,8);
            local_c00 = auVar3._0_8_;
            uStackY_bf8 = auVar3._8_8_;
            *(undefined8 *)(local_950 + local_b68) = local_c00;
            ((undefined8 *)(local_950 + local_b68))[1] = uStackY_bf8;
          }
          local_a08 = local_a08 + (long)in_ECX * 2;
          local_a10 = local_a10 + (long)in_R9D * 2;
          local_950 = local_950 + h;
        }
      }
      else {
        for (local_c14 = 0; local_c14 < in_stack_00000008; local_c14 = local_c14 + 1) {
          for (local_c18 = 0; local_c18 < h; local_c18 = local_c18 + 0x10) {
            pauVar1 = (undefined1 (*) [12])(local_a08 + (long)local_c18 * 2);
            uStack_634 = (undefined4)((ulong)*(undefined8 *)(*pauVar1 + 8) >> 0x20);
            uStack_62c = (undefined4)((ulong)*(undefined8 *)(pauVar1[1] + 4) >> 0x20);
            uStack_624 = (undefined4)((ulong)*(undefined8 *)pauVar1[2] >> 0x20);
            auVar3._12_4_ = uStack_634;
            auVar3._0_12_ = *pauVar1;
            auVar3._16_4_ = (int)*(undefined8 *)(pauVar1[1] + 4);
            auVar3._20_4_ = uStack_62c;
            auVar3._24_4_ = (int)*(undefined8 *)pauVar1[2];
            auVar3._28_4_ = uStack_624;
            auVar3 = vpsubw_avx2(auVar3,*(undefined1 (*) [32])(local_a10 + (long)local_c18 * 2));
            auVar3 = vpabsw_avx2(auVar3);
            auVar3 = vpsraw_avx2(auVar3,auVar15);
            auVar10._16_8_ = uStack_90;
            auVar10._0_16_ = auVar14;
            auVar10._24_8_ = uStack_88;
            auVar3 = vpaddw_avx2(auVar3,auVar10);
            auVar3 = vpmaxsw_avx2(ZEXT1632(ZEXT816(0)),auVar3);
            auVar6._16_8_ = uStack_d0;
            auVar6._0_16_ = auVar2;
            auVar6._24_8_ = uStack_c8;
            auVar3 = vpminsw_avx2(auVar3,auVar6);
            auVar3 = vpackuswb_avx2(auVar3,auVar3);
            auVar3 = vpermq_avx2(auVar3,8);
            local_ca0 = auVar3._0_8_;
            uStackY_c98 = auVar3._8_8_;
            *(undefined8 *)(local_950 + local_c18) = local_ca0;
            ((undefined8 *)(local_950 + local_c18))[1] = uStackY_c98;
          }
          local_a08 = local_a08 + (long)in_ECX * 2;
          local_a10 = local_a10 + (long)in_R9D * 2;
          local_950 = local_950 + h;
        }
      }
    }
  }
  return;
}

Assistant:

void av1_build_compound_diffwtd_mask_highbd_avx2(
    uint8_t *mask, DIFFWTD_MASK_TYPE mask_type, const uint8_t *src0,
    int src0_stride, const uint8_t *src1, int src1_stride, int h, int w,
    int bd) {
  if (w < 16) {
    av1_build_compound_diffwtd_mask_highbd_ssse3(
        mask, mask_type, src0, src0_stride, src1, src1_stride, h, w, bd);
  } else {
    assert(mask_type == DIFFWTD_38 || mask_type == DIFFWTD_38_INV);
    assert(bd >= 8);
    assert((w % 16) == 0);
    const __m256i y0 = _mm256_setzero_si256();
    const __m256i yAOM_BLEND_A64_MAX_ALPHA =
        _mm256_set1_epi16(AOM_BLEND_A64_MAX_ALPHA);
    const int mask_base = 38;
    const __m256i ymask_base = _mm256_set1_epi16(mask_base);
    const uint16_t *ssrc0 = CONVERT_TO_SHORTPTR(src0);
    const uint16_t *ssrc1 = CONVERT_TO_SHORTPTR(src1);
    if (bd == 8) {
      if (mask_type == DIFFWTD_38_INV) {
        for (int i = 0; i < h; ++i) {
          for (int j = 0; j < w; j += 16) {
            __m256i s0 = _mm256_loadu_si256((const __m256i *)&ssrc0[j]);
            __m256i s1 = _mm256_loadu_si256((const __m256i *)&ssrc1[j]);
            __m256i diff = _mm256_srai_epi16(
                _mm256_abs_epi16(_mm256_sub_epi16(s0, s1)), DIFF_FACTOR_LOG2);
            __m256i m = _mm256_min_epi16(
                _mm256_max_epi16(y0, _mm256_add_epi16(diff, ymask_base)),
                yAOM_BLEND_A64_MAX_ALPHA);
            m = _mm256_sub_epi16(yAOM_BLEND_A64_MAX_ALPHA, m);
            m = _mm256_packus_epi16(m, m);
            m = _mm256_permute4x64_epi64(m, _MM_SHUFFLE(0, 0, 2, 0));
            __m128i m0 = _mm256_castsi256_si128(m);
            _mm_storeu_si128((__m128i *)&mask[j], m0);
          }
          ssrc0 += src0_stride;
          ssrc1 += src1_stride;
          mask += w;
        }
      } else {
        for (int i = 0; i < h; ++i) {
          for (int j = 0; j < w; j += 16) {
            __m256i s0 = _mm256_loadu_si256((const __m256i *)&ssrc0[j]);
            __m256i s1 = _mm256_loadu_si256((const __m256i *)&ssrc1[j]);
            __m256i diff = _mm256_srai_epi16(
                _mm256_abs_epi16(_mm256_sub_epi16(s0, s1)), DIFF_FACTOR_LOG2);
            __m256i m = _mm256_min_epi16(
                _mm256_max_epi16(y0, _mm256_add_epi16(diff, ymask_base)),
                yAOM_BLEND_A64_MAX_ALPHA);
            m = _mm256_packus_epi16(m, m);
            m = _mm256_permute4x64_epi64(m, _MM_SHUFFLE(0, 0, 2, 0));
            __m128i m0 = _mm256_castsi256_si128(m);
            _mm_storeu_si128((__m128i *)&mask[j], m0);
          }
          ssrc0 += src0_stride;
          ssrc1 += src1_stride;
          mask += w;
        }
      }
    } else {
      const __m128i xshift = _mm_set1_epi64x(bd - 8 + DIFF_FACTOR_LOG2);
      if (mask_type == DIFFWTD_38_INV) {
        for (int i = 0; i < h; ++i) {
          for (int j = 0; j < w; j += 16) {
            __m256i s0 = _mm256_loadu_si256((const __m256i *)&ssrc0[j]);
            __m256i s1 = _mm256_loadu_si256((const __m256i *)&ssrc1[j]);
            __m256i diff = _mm256_sra_epi16(
                _mm256_abs_epi16(_mm256_sub_epi16(s0, s1)), xshift);
            __m256i m = _mm256_min_epi16(
                _mm256_max_epi16(y0, _mm256_add_epi16(diff, ymask_base)),
                yAOM_BLEND_A64_MAX_ALPHA);
            m = _mm256_sub_epi16(yAOM_BLEND_A64_MAX_ALPHA, m);
            m = _mm256_packus_epi16(m, m);
            m = _mm256_permute4x64_epi64(m, _MM_SHUFFLE(0, 0, 2, 0));
            __m128i m0 = _mm256_castsi256_si128(m);
            _mm_storeu_si128((__m128i *)&mask[j], m0);
          }
          ssrc0 += src0_stride;
          ssrc1 += src1_stride;
          mask += w;
        }
      } else {
        for (int i = 0; i < h; ++i) {
          for (int j = 0; j < w; j += 16) {
            __m256i s0 = _mm256_loadu_si256((const __m256i *)&ssrc0[j]);
            __m256i s1 = _mm256_loadu_si256((const __m256i *)&ssrc1[j]);
            __m256i diff = _mm256_sra_epi16(
                _mm256_abs_epi16(_mm256_sub_epi16(s0, s1)), xshift);
            __m256i m = _mm256_min_epi16(
                _mm256_max_epi16(y0, _mm256_add_epi16(diff, ymask_base)),
                yAOM_BLEND_A64_MAX_ALPHA);
            m = _mm256_packus_epi16(m, m);
            m = _mm256_permute4x64_epi64(m, _MM_SHUFFLE(0, 0, 2, 0));
            __m128i m0 = _mm256_castsi256_si128(m);
            _mm_storeu_si128((__m128i *)&mask[j], m0);
          }
          ssrc0 += src0_stride;
          ssrc1 += src1_stride;
          mask += w;
        }
      }
    }
  }
}